

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_band.c
# Opt level: O0

int check_vector(N_Vector X,N_Vector Y,sunrealtype tol)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  sunrealtype maxerr;
  sunrealtype *Ydata;
  sunrealtype *Xdata;
  sunindextype local_length;
  sunindextype i;
  int failure;
  double local_58;
  double local_50;
  long local_30;
  int local_24;
  int local_4;
  
  local_24 = 0;
  lVar2 = N_VGetArrayPointer(in_RDI);
  lVar3 = N_VGetArrayPointer(in_RSI);
  lVar4 = N_VGetLength_Serial(in_RDI);
  for (local_30 = 0; local_30 < lVar4; local_30 = local_30 + 1) {
    iVar1 = SUNRCompareTol(*(undefined8 *)(lVar2 + local_30 * 8),
                           (int)*(undefined8 *)(lVar3 + local_30 * 8),in_XMM0_Qa);
    local_24 = iVar1 + local_24;
  }
  if ((double)local_24 <= 0.0) {
    local_4 = 0;
  }
  else {
    local_50 = 0.0;
    for (local_30 = 0; local_30 < lVar4; local_30 = local_30 + 1) {
      if (ABS(*(double *)(lVar2 + local_30 * 8) - *(double *)(lVar3 + local_30 * 8)) <= local_50) {
        local_58 = local_50;
      }
      else {
        local_58 = ABS(*(double *)(lVar2 + local_30 * 8) - *(double *)(lVar3 + local_30 * 8));
      }
      local_50 = local_58;
    }
    printf("check err failure: maxerr = %g (tol = %g)\n",local_50,(int)in_XMM0_Qa);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int check_vector(N_Vector X, N_Vector Y, sunrealtype tol)
{
  int failure = 0;
  sunindextype i, local_length;
  sunrealtype *Xdata, *Ydata, maxerr;

  Xdata        = N_VGetArrayPointer(X);
  Ydata        = N_VGetArrayPointer(Y);
  local_length = N_VGetLength_Serial(X);

  /* check vector data */
  for (i = 0; i < local_length; i++)
  {
    failure += SUNRCompareTol(Xdata[i], Ydata[i], tol);
  }

  if (failure > ZERO)
  {
    maxerr = ZERO;
    for (i = 0; i < local_length; i++)
    {
      maxerr = SUNMAX(SUNRabs(Xdata[i] - Ydata[i]), maxerr);
    }
    printf("check err failure: maxerr = %" GSYM " (tol = %" GSYM ")\n", maxerr,
           tol);
    return (1);
  }
  else { return (0); }
}